

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::base::DefaultLogDispatchCallback::handle(DefaultLogDispatchCallback *this,LogDispatchData *data)

{
  element_type *peVar1;
  string_t local_30;
  
  this->m_data = data;
  peVar1 = (data->m_logMessage->m_logger->m_logBuilder).
           super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_LogBuilder[2])
            (&local_30,peVar1,data->m_logMessage,(ulong)(data->m_dispatchAction == NormalLog));
  dispatch(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DefaultLogDispatchCallback::handle(const LogDispatchData* data) {
#if defined(ELPP_THREAD_SAFE)
  LogDispatchCallback::handle(data);
  base::threading::ScopedLock scopedLock(fileHandle(data));
#endif
  m_data = data;
  dispatch(m_data->logMessage()->logger()->logBuilder()->build(m_data->logMessage(),
           m_data->dispatchAction() == base::DispatchAction::NormalLog));
}